

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

HttpResponse * asl::Http::request(HttpResponse *__return_storage_ptr__,HttpRequest *request)

{
  AtomicCount *pAVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  size_t in_RCX;
  void *__buf;
  anon_union_16_2_78e7fdac_for_String_2 *paVar6;
  undefined8 uVar7;
  Socket socket;
  String title;
  Array<asl::String> parts;
  String loc;
  String line;
  Url url;
  HttpResponse response;
  SmartObject local_2b0;
  String local_2a8;
  undefined1 local_290 [16];
  anon_union_16_2_78e7fdac_for_String_2 local_280;
  String local_270;
  String local_258;
  Url local_240;
  HttpResponse local_1f0;
  HttpRequest local_168;
  
  local_2b0._p = (SmartObject_ *)0x0;
  HttpResponse::HttpResponse(&local_1f0,request);
  HttpResponse::setCode(&local_1f0,0);
  Url::Url(&local_240,&request->_url);
  iVar4 = local_240.port;
  uVar7 = local_240.protocol.field_2._str;
  if (local_240.protocol._size == 0) {
    uVar7 = &local_240.protocol.field_2;
  }
  iVar3 = strcmp((char *)uVar7,"https");
  if (iVar3 == 0) {
    String::String((String *)&local_168,"SOCKET_NO_TLS_AVAILABLE");
    uVar7 = local_168.super_HttpMessage._command.field_2._str;
    if (local_168.super_HttpMessage._command._size == 0) {
      uVar7 = &local_168.super_HttpMessage._command.field_2;
    }
    String::assign(&local_1f0.super_HttpMessage._socketError,(char *)uVar7,
                   local_168.super_HttpMessage._command._len);
    if (local_168.super_HttpMessage._command._size != 0) {
      free(local_168.super_HttpMessage._command.field_2._str);
    }
    HttpMessage::HttpMessage
              (&__return_storage_ptr__->super_HttpMessage,&local_1f0.super_HttpMessage);
  }
  else {
    Socket::Socket((Socket *)&local_168);
    if ((Socket_ *)local_2b0._p != (Socket_ *)0x0) {
      LOCK();
      pAVar1 = &(local_2b0._p)->rc;
      pAVar1->n = pAVar1->n + -1;
      UNLOCK();
      if ((pAVar1->n == 0) && ((Socket_ *)local_2b0._p != (Socket_ *)0x0)) {
        (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[1])();
      }
    }
    local_2b0._p = (SmartObject_ *)
                   CONCAT44(local_168.super_HttpMessage._command._len,
                            local_168.super_HttpMessage._command._size);
    if ((Socket_ *)local_2b0._p != (Socket_ *)0x0) {
      LOCK();
      pAVar1 = &(((Socket_ *)local_2b0._p)->super_SmartObject_).rc;
      pAVar1->n = pAVar1->n + 1;
      UNLOCK();
    }
    if (CONCAT44(local_168.super_HttpMessage._command._len,
                 local_168.super_HttpMessage._command._size) != 0) {
      LOCK();
      piVar2 = (int *)(CONCAT44(local_168.super_HttpMessage._command._len,
                                local_168.super_HttpMessage._command._size) + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) &&
         ((long *)CONCAT44(local_168.super_HttpMessage._command._len,
                           local_168.super_HttpMessage._command._size) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_168.super_HttpMessage._command._len,
                                       local_168.super_HttpMessage._command._size) + 8))();
      }
    }
    if (iVar4 == 0) {
      local_240.port = 0x50;
    }
    local_1f0.super_HttpMessage._socket = (Socket *)&local_2b0;
    (request->super_HttpMessage)._socket = local_1f0.super_HttpMessage._socket;
    iVar3 = Socket::connect(local_1f0.super_HttpMessage._socket,(int)&local_240 + 0x18,
                            (sockaddr *)(ulong)(uint)local_240.port,(socklen_t)in_RCX);
    if ((char)iVar3 != '\0') {
      if (*(int *)((request->super_HttpMessage)._body._a + -0x10) != 0) {
        String::String((String *)&local_168,"Content-Length");
        String::String(&local_2a8,*(int *)((request->super_HttpMessage)._body._a + -0x10));
        HttpMessage::setHeader(&request->super_HttpMessage,(String *)&local_168,&local_2a8);
        if (local_2a8._size != 0) {
          free((void *)CONCAT71(local_2a8.field_2._1_7_,local_2a8.field_2._space[0]));
        }
        if (local_168.super_HttpMessage._command._size != 0) {
          free(local_168.super_HttpMessage._command.field_2._str);
        }
      }
      local_2a8.field_2._space[0] = '\0';
      local_2a8._size = 0;
      local_2a8._len = 0;
      if ((request->_method)._size == 0) {
        paVar6 = &(request->_method).field_2;
      }
      else {
        paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(request->_method).field_2._str;
      }
      String::append(&local_2a8,paVar6->_space,(request->_method)._len);
      String::operator+=(&local_2a8,' ');
      uVar7 = local_240.path.field_2._str;
      if (local_240.path._size == 0) {
        uVar7 = &local_240.path.field_2;
      }
      String::append(&local_2a8,(char *)uVar7,local_240.path._len);
      String::append(&local_2a8," HTTP/1.1\r\nHost: ",0x11);
      uVar7 = local_240.host.field_2._str;
      if (local_240.host._size == 0) {
        uVar7 = &local_240.host.field_2;
      }
      String::append(&local_2a8,(char *)uVar7,local_240.host._len);
      if (iVar4 != 0) {
        String::operator+=(&local_2a8,':');
        String::operator<<(&local_2a8,&local_240.port);
      }
      if (local_2a8._size == 0) {
        paVar6 = &local_2a8.field_2;
      }
      else {
        paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_2a8.field_2._1_7_,local_2a8.field_2._space[0]);
      }
      String::assign((String *)request,paVar6->_space,local_2a8._len);
      sVar5 = HttpMessage::write(&request->super_HttpMessage,(int)paVar6,__buf,in_RCX);
      if ((char)sVar5 == '\0') {
        (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])
                  (&local_168);
        uVar7 = local_168.super_HttpMessage._command.field_2._str;
        if (local_168.super_HttpMessage._command._size == 0) {
          uVar7 = &local_168.super_HttpMessage._command.field_2;
        }
        String::assign(&local_1f0.super_HttpMessage._socketError,(char *)uVar7,
                       local_168.super_HttpMessage._command._len);
        if (local_168.super_HttpMessage._command._size != 0) {
          free(local_168.super_HttpMessage._command.field_2._str);
        }
        HttpMessage::HttpMessage
                  (&__return_storage_ptr__->super_HttpMessage,&local_1f0.super_HttpMessage);
        __return_storage_ptr__->_code = local_1f0._code;
      }
      else {
        Socket_::readLine(&local_258,(Socket_ *)local_2b0._p);
        if (local_258._len < 1) {
          (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
          (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])
                    (&local_168);
          uVar7 = local_168.super_HttpMessage._command.field_2._str;
          if (local_168.super_HttpMessage._command._size == 0) {
            uVar7 = &local_168.super_HttpMessage._command.field_2;
          }
          String::assign(&local_1f0.super_HttpMessage._socketError,(char *)uVar7,
                         local_168.super_HttpMessage._command._len);
          if (local_168.super_HttpMessage._command._size != 0) {
            free(local_168.super_HttpMessage._command.field_2._str);
          }
          HttpMessage::HttpMessage
                    (&__return_storage_ptr__->super_HttpMessage,&local_1f0.super_HttpMessage);
          __return_storage_ptr__->_code = local_1f0._code;
        }
        else {
          String::split((String *)local_290);
          if (*(int *)&((String *)(local_290._0_8_ + -0x18))->field_2 < 2) {
            (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
            (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])
                      (&local_168);
            uVar7 = local_168.super_HttpMessage._command.field_2._str;
            if (local_168.super_HttpMessage._command._size == 0) {
              uVar7 = &local_168.super_HttpMessage._command.field_2;
            }
            String::assign(&local_1f0.super_HttpMessage._socketError,(char *)uVar7,
                           local_168.super_HttpMessage._command._len);
            if (local_168.super_HttpMessage._command._size != 0) {
              free(local_168.super_HttpMessage._command.field_2._str);
            }
            HttpMessage::HttpMessage
                      (&__return_storage_ptr__->super_HttpMessage,&local_1f0.super_HttpMessage);
LAB_001240ae:
            __return_storage_ptr__->_code = local_1f0._code;
          }
          else {
            if (*(int *)local_290._0_8_ == 0) {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)(local_290._0_8_ + 8);
            }
            else {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       ((anon_union_16_2_78e7fdac_for_String_2 *)(local_290._0_8_ + 8))->_str;
            }
            String::assign(&local_1f0.super_HttpMessage._proto,paVar6->_space,
                           *(int *)(local_290._0_8_ + 4));
            if (((String *)(local_290._0_8_ + 0x18))->_size == 0) {
              paVar6 = &((String *)(local_290._0_8_ + 0x18))->field_2;
            }
            else {
              paVar6 = (anon_union_16_2_78e7fdac_for_String_2 *)
                       (((String *)(local_290._0_8_ + 0x18))->field_2)._str;
            }
            iVar4 = myatoi(paVar6->_space);
            HttpResponse::setCode(&local_1f0,iVar4);
            HttpMessage::readHeaders(&local_1f0.super_HttpMessage);
            if (((request->_followRedirects != true) || (7 < local_1f0._code - 0x12dU)) ||
               ((0xc3U >> (local_1f0._code - 0x12dU & 0x1f) & 1) == 0)) {
              local_1f0.super_HttpMessage._progress.f = (request->super_HttpMessage)._progress.f;
              (request->super_HttpMessage)._progress.f =
                   (_FuncB<void,_const_asl::HttpStatus_&,_asl::NoType> *)0x0;
              HttpMessage::useSink(&local_1f0.super_HttpMessage,&(request->super_HttpMessage)._sink)
              ;
              HttpMessage::readBody(&local_1f0.super_HttpMessage);
              (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
              HttpMessage::HttpMessage
                        (&__return_storage_ptr__->super_HttpMessage,&local_1f0.super_HttpMessage);
              goto LAB_001240ae;
            }
            (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
            String::String((String *)&local_168,"Location");
            HttpMessage::header(&local_270,&local_1f0.super_HttpMessage,(String *)&local_168);
            if (local_168.super_HttpMessage._command._size != 0) {
              free(local_168.super_HttpMessage._command.field_2._str);
            }
            HttpRequest::HttpRequest(&local_168,request);
            local_168.super_HttpMessage._headersSent = false;
            uVar7 = local_270.field_2._str;
            if (local_270._size == 0) {
              uVar7 = &local_270.field_2;
            }
            String::assign(&local_168._url,(char *)uVar7,local_270._len);
            if (request->_recursion < 3) {
              local_168._recursion = request->_recursion + 1;
              Http::request(__return_storage_ptr__,&local_168);
            }
            else {
              HttpResponse::setCode(&local_1f0,0x1a5);
              String::String((String *)(local_290 + 8),"Too many redirects");
              uVar7 = local_280._0_8_;
              if (local_290._8_4_ == 0) {
                uVar7 = &local_280;
              }
              String::assign(&local_1f0.super_HttpMessage._socketError,(char *)uVar7,
                             local_290._12_4_);
              if (local_290._8_4_ != 0) {
                free((void *)local_280._0_8_);
              }
              HttpMessage::HttpMessage
                        (&__return_storage_ptr__->super_HttpMessage,&local_1f0.super_HttpMessage);
              __return_storage_ptr__->_code = local_1f0._code;
            }
            HttpRequest::~HttpRequest(&local_168);
            if (local_270._size != 0) {
              free(local_270.field_2._str);
            }
          }
          Array<asl::String>::~Array((Array<asl::String> *)local_290);
        }
        if (local_258._size != 0) {
          free(local_258.field_2._str);
        }
      }
      if (local_2a8._size != 0) {
        free((void *)CONCAT71(local_2a8.field_2._1_7_,local_2a8.field_2._space[0]));
      }
      goto LAB_001240e7;
    }
    (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0xb])();
    (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[0x10])(&local_168);
    uVar7 = local_168.super_HttpMessage._command.field_2._str;
    if (local_168.super_HttpMessage._command._size == 0) {
      uVar7 = &local_168.super_HttpMessage._command.field_2;
    }
    String::assign(&local_1f0.super_HttpMessage._socketError,(char *)uVar7,
                   local_168.super_HttpMessage._command._len);
    if (local_168.super_HttpMessage._command._size != 0) {
      free(local_168.super_HttpMessage._command.field_2._str);
    }
    HttpMessage::HttpMessage
              (&__return_storage_ptr__->super_HttpMessage,&local_1f0.super_HttpMessage);
  }
  __return_storage_ptr__->_code = local_1f0._code;
LAB_001240e7:
  if (local_240.path._size != 0) {
    free(local_240.path.field_2._str);
  }
  if (local_240.host._size != 0) {
    free(local_240.host.field_2._str);
  }
  if (local_240.protocol._size != 0) {
    free(local_240.protocol.field_2._str);
  }
  HttpMessage::~HttpMessage(&local_1f0.super_HttpMessage);
  if ((Socket_ *)local_2b0._p != (Socket_ *)0x0) {
    LOCK();
    pAVar1 = &(local_2b0._p)->rc;
    pAVar1->n = pAVar1->n + -1;
    UNLOCK();
    if ((pAVar1->n == 0) && ((Socket_ *)local_2b0._p != (Socket_ *)0x0)) {
      (*((SmartObject_ *)&(local_2b0._p)->_vptr_SmartObject_)->_vptr_SmartObject_[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

HttpResponse Http::request(HttpRequest& request)
{
	Socket socket((Socket::Ptr)NULL);
	HttpResponse response(request);
	response.setCode(0);

	Url url(request.url());
	bool hasPort = url.port != 0;

	if (url.protocol == "https")
	{
#ifdef ASL_TLS
		socket = TlsSocket();
		if (!hasPort) url.port = 443;
#else
		response.setSockError("SOCKET_NO_TLS_AVAILABLE");
		return response;
#endif
	}
	else {
		socket = Socket();
		if (!hasPort) url.port = 80;
	}

	response.use(socket);
	request.use(socket);

	if (!socket.connect(url.host, url.port)) {
		//printf("Cannot connect to %s : %i\n", *url.host, url.port);
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	if (request.body().length() != 0) {
		request.setHeader("Content-Length", request.body().length());
	}

	String title;
	title << request.method() << ' ' << url.path << " HTTP/1.1\r\nHost: " << url.host;
	if (hasPort)
		title << ':' << url.port;
	request._command = title;

	if (!request.write())
	{
		response.setSockError(socket.errorMsg());
		return response;
	}
	
	String line = socket.readLine();
	if (!line.ok()) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}
	Array<String> parts = line.split();
	if (parts.length() < 2) {
		socket.close();
		response.setSockError(socket.errorMsg());
		return response;
	}

	response.setProto(parts[0]);
	response.setCode(parts[1]);
	response.readHeaders();

	int code = response.code();

	if (request.followRedirects() && (code == 301 || code == 302 || code == 307 || code == 308)) // 303 ?
	{
		socket.close();
		String loc = response.header("Location");
		HttpRequest req(request);
		req.setUrl(loc);
		Http::Progress progress = req._progress;
		req.onProgress(progress);
		int n = request.recursion() + 1;
		if (n < 4) {
			req.setRecursion(n);
			return Http::request(req);
		}
		else {
			response.setCode(421);
			response.setSockError("Too many redirects");
			return response;
		}
	}

	response.onProgress(request._progress);
	response.useSink(request._sink);

	response.readBody();

	socket.close();
	return response;
}